

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NotificationDispatcher.cpp
# Opt level: O2

void __thiscall NotificationDispatcher::Run(NotificationDispatcher *this)

{
  RingBuffer *this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  unsigned_long timestamp;
  ostream *poVar5;
  uint uVar6;
  int iVar7;
  shared_ptr<Notification> notification;
  string local_1d8;
  stringstream stream;
  ostream local_1a8 [376];
  
  this_00 = &this->ring;
  do {
    Semaphore::acquire(&this->sem);
    if (((this->stopExecution)._M_base._M_i & 1U) != 0) {
      return;
    }
    uVar2 = RingBuffer::ReadFromLittleEndian<unsigned_int>(this_00);
    RingBuffer::ReadFromLittleEndian<unsigned_int>(this_00);
    uVar3 = RingBuffer::ReadFromLittleEndian<unsigned_int>(this_00);
    uVar2 = uVar2 - 8;
    for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
      timestamp = RingBuffer::ReadFromLittleEndian<unsigned_long>(this_00);
      uVar4 = RingBuffer::ReadFromLittleEndian<unsigned_int>(this_00);
      uVar2 = uVar2 - 0xc;
      iVar7 = uVar4 + 1;
      while (iVar7 = iVar7 + -1, iVar7 != 0) {
        RingBuffer::ReadFromLittleEndian<unsigned_int>(this_00);
        uVar4 = RingBuffer::ReadFromLittleEndian<unsigned_int>(this_00);
        uVar2 = uVar2 - 8;
        Find((NotificationDispatcher *)&notification,(uint32_t)this);
        if (notification.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          RingBuffer::Read(this_00,(ulong)uVar4);
LAB_00134936:
          uVar2 = uVar2 - uVar4;
          bVar1 = true;
        }
        else {
          if (uVar4 == *(uint *)(((notification.
                                   super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->buffer).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 0xc)) {
            Notification::Notify
                      (notification.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,timestamp,this_00);
            goto LAB_00134936;
          }
          std::__cxx11::stringstream::stringstream((stringstream *)&stream);
          poVar5 = std::operator<<(local_1a8,"Notification sample size: ");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          poVar5 = std::operator<<(poVar5," doesn\'t match: ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__cxx11::stringbuf::str();
          Logger::Log(2,&local_1d8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
          bVar1 = false;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&notification.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (!bVar1) goto LAB_001349da;
      }
    }
LAB_001349da:
    RingBuffer::Read(this_00,(ulong)uVar2);
  } while( true );
}

Assistant:

void NotificationDispatcher::Run()
{
    for ( ; ; ) {
        sem.acquire();
        if (stopExecution) {
            return;
        }
        auto fullLength = ring.ReadFromLittleEndian<uint32_t>();
        const auto length = ring.ReadFromLittleEndian<uint32_t>();
        (void)length;
        const auto numStamps = ring.ReadFromLittleEndian<uint32_t>();
        fullLength -= sizeof(length) + sizeof(numStamps);
        for (uint32_t stamp = 0; stamp < numStamps; ++stamp) {
            const auto timestamp = ring.ReadFromLittleEndian<uint64_t>();
            const auto numSamples = ring.ReadFromLittleEndian<uint32_t>();
            fullLength -= sizeof(timestamp) + sizeof(numSamples);
            for (uint32_t sample = 0; sample < numSamples; ++sample) {
                const auto hNotify = ring.ReadFromLittleEndian<uint32_t>();
                const auto size = ring.ReadFromLittleEndian<uint32_t>();
                fullLength -= sizeof(hNotify) + sizeof(size);
                const auto notification = Find(hNotify);
                if (notification) {
                    if (size != notification->Size()) {
                        LOG_WARN("Notification sample size: " << size << " doesn't match: " << notification->Size());
                        goto cleanup;
                    }
                    notification->Notify(timestamp, ring);
                } else {
                    ring.Read(size);
                }
                fullLength -= size;
            }
        }
cleanup:
        ring.Read(fullLength);
    }
}